

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O0

void __thiscall FIX::Session::generateReject(Session *this,Message *message,int err,int field)

{
  char *__s;
  bool bVar1;
  StringField *this_00;
  string *psVar2;
  Header *pHVar3;
  FieldMap *pFVar4;
  uint64_t uVar5;
  SEQNUM SVar6;
  runtime_error *this_01;
  unsigned_long value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  allocator<char> local_4a1;
  string local_4a0;
  string local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  allocator<char> local_3b9;
  string local_3b8;
  char *local_398;
  char *reason;
  FieldBase local_338;
  FieldBase local_2e0;
  FieldBase *local_288;
  MsgType *msgType;
  MsgSeqNum msgSeqNum;
  allocator<char> local_211;
  STRING local_210;
  MsgType local_1f0;
  undefined1 local_198 [8];
  Message reject;
  string beginString;
  int field_local;
  int err_local;
  Message *message_local;
  Session *this_local;
  
  this_00 = &SessionID::getBeginString(&this->m_sessionID)->super_StringField;
  psVar2 = StringField::operator_cast_to_string_(this_00);
  std::__cxx11::string::string((string *)&reject.m_validStructure,(string *)psVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"3",&local_211);
  MsgType::MsgType(&local_1f0,&local_210);
  newMessage((Message *)local_198,this,&local_1f0);
  MsgType::~MsgType(&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator(&local_211);
  pHVar3 = Message::getHeader(message);
  Message::reverseRoute((Message *)local_198,pHVar3);
  pHVar3 = Message::getHeader((Message *)local_198);
  fill(this,pHVar3);
  MsgSeqNum::MsgSeqNum((MsgSeqNum *)&msgType);
  pFVar4 = &Message::getHeader(message)->super_FieldMap;
  local_288 = (FieldBase *)FieldMap::getField<FIX::MsgType>(pFVar4);
  pFVar4 = &Message::getHeader(message)->super_FieldMap;
  bVar1 = FieldMap::getFieldIfSet(pFVar4,(FieldBase *)&msgType);
  if (bVar1) {
    psVar2 = FieldBase::getString_abi_cxx11_((FieldBase *)&msgType);
    bVar1 = std::operator!=(psVar2,"");
    if (bVar1) {
      uVar5 = UInt64Field::operator_cast_to_unsigned_long((UInt64Field *)&msgType);
      RefSeqNum::RefSeqNum((RefSeqNum *)&local_2e0,uVar5);
      FieldMap::setField((FieldMap *)local_198,&local_2e0,true);
      RefSeqNum::~RefSeqNum((RefSeqNum *)&local_2e0);
    }
  }
  bVar1 = std::operator>=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &reject.m_validStructure,"FIX.4.2");
  if (bVar1) {
    psVar2 = FieldBase::getString_abi_cxx11_(local_288);
    bVar1 = std::operator!=(psVar2,"");
    if (bVar1) {
      psVar2 = StringField::operator_cast_to_string_((StringField *)local_288);
      RefMsgType::RefMsgType((RefMsgType *)&local_338,psVar2);
      FieldMap::setField((FieldMap *)local_198,&local_338,true);
      RefMsgType::~RefMsgType((RefMsgType *)&local_338);
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &reject.m_validStructure,"FIX.4.2");
    if (((bVar1) && (err < 0xc)) ||
       (bVar1 = std::operator>((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &reject.m_validStructure,"FIX.4.2"), bVar1)) {
      SessionRejectReason::SessionRejectReason((SessionRejectReason *)&reason,err);
      FieldMap::setField((FieldMap *)local_198,(FieldBase *)&reason,true);
      SessionRejectReason::~SessionRejectReason((SessionRejectReason *)&reason);
    }
  }
  bVar1 = FIX::operator!=((StringField *)local_288,"A");
  if ((bVar1) && (bVar1 = FIX::operator!=((StringField *)local_288,"4"), bVar1)) {
    uVar5 = UInt64Field::operator_cast_to_unsigned_long((UInt64Field *)&msgType);
    SVar6 = getExpectedTargetNum(this);
    if (uVar5 == SVar6) {
      SessionState::incrNextTargetMsgSeqNum(&this->m_state);
    }
  }
  local_398 = (char *)0x0;
  switch(err) {
  case 0:
    local_398 = "Invalid tag number";
    break;
  case 1:
    local_398 = "Required tag missing";
    break;
  case 2:
    local_398 = "Tag not defined for this message type";
    break;
  case 4:
    local_398 = "Tag specified without a value";
    break;
  case 5:
    local_398 = "Value is incorrect (out of range) for this tag";
    break;
  case 6:
    local_398 = "Incorrect data format for value";
    break;
  case 9:
    local_398 = "CompID problem";
    break;
  case 10:
    local_398 = "SendingTime accuracy problem";
    break;
  case 0xb:
    local_398 = "Invalid MsgType";
    break;
  case 0xd:
    local_398 = "Tag appears more than once";
    break;
  case 0xe:
    local_398 = "Tag specified out of required order";
    break;
  case 0x10:
    local_398 = "Incorrect NumInGroup count for repeating group";
  }
  __s = local_398;
  if ((local_398 == (char *)0x0) || ((field == 0 && (err != 0)))) {
    if (local_398 == (char *)0x0) {
      psVar2 = FieldBase::getString_abi_cxx11_((FieldBase *)&msgType);
      std::operator+(&local_548,"Message ",psVar2);
      std::operator+(&local_528,&local_548," Rejected");
      SessionState::onEvent(&this->m_state,&local_528);
      std::__cxx11::string::~string((string *)&local_528);
      std::__cxx11::string::~string((string *)&local_548);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a0,__s,&local_4a1);
      populateRejectReason(this,(Message *)local_198,&local_4a0);
      std::__cxx11::string::~string((string *)&local_4a0);
      std::allocator<char>::~allocator(&local_4a1);
      psVar2 = FieldBase::getString_abi_cxx11_((FieldBase *)&msgType);
      std::operator+(&local_508,"Message ",psVar2);
      std::operator+(&local_4e8,&local_508," Rejected: ");
      std::operator+(&local_4c8,&local_4e8,local_398);
      SessionState::onEvent(&this->m_state,&local_4c8);
      std::__cxx11::string::~string((string *)&local_4c8);
      std::__cxx11::string::~string((string *)&local_4e8);
      std::__cxx11::string::~string((string *)&local_508);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b8,__s,&local_3b9);
    populateRejectReason(this,(Message *)local_198,field,&local_3b8);
    std::__cxx11::string::~string((string *)&local_3b8);
    std::allocator<char>::~allocator(&local_3b9);
    psVar2 = FieldBase::getString_abi_cxx11_((FieldBase *)&msgType);
    std::operator+(&local_460,"Message ",psVar2);
    std::operator+(&local_440,&local_460," Rejected: ");
    std::operator+(&local_420,&local_440,local_398);
    std::operator+(&local_400,&local_420,":");
    IntTConvertor<unsigned_long>::convert_abi_cxx11_
              (&local_480,(IntTConvertor<unsigned_long> *)(long)field,value);
    std::operator+(&local_3e0,&local_400,&local_480);
    SessionState::onEvent(&this->m_state,&local_3e0);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::__cxx11::string::~string((string *)&local_480);
    std::__cxx11::string::~string((string *)&local_400);
    std::__cxx11::string::~string((string *)&local_420);
    std::__cxx11::string::~string((string *)&local_440);
    std::__cxx11::string::~string((string *)&local_460);
  }
  bVar1 = SessionState::receivedLogon(&this->m_state);
  if (!bVar1) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"Tried to send a reject while not logged on");
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  sendRaw(this,(Message *)local_198,0);
  MsgSeqNum::~MsgSeqNum((MsgSeqNum *)&msgType);
  Message::~Message((Message *)local_198);
  std::__cxx11::string::~string((string *)&reject.m_validStructure);
  return;
}

Assistant:

void Session::generateReject(const Message &message, int err, int field) {
  std::string beginString = m_sessionID.getBeginString();

  Message reject = newMessage(MsgType(MsgType_Reject));

  reject.reverseRoute(message.getHeader());
  fill(reject.getHeader());

  MsgSeqNum msgSeqNum;

  auto const &msgType = message.getHeader().getField<MsgType>();
  if (message.getHeader().getFieldIfSet(msgSeqNum)) {
    if (msgSeqNum.getString() != "") {
      reject.setField(RefSeqNum(msgSeqNum));
    }
  }

  if (beginString >= FIX::BeginString_FIX42) {
    if (msgType.getString() != "") {
      reject.setField(RefMsgType(msgType));
    }
    if ((beginString == FIX::BeginString_FIX42 && err <= SessionRejectReason_INVALID_MSGTYPE)
        || beginString > FIX::BeginString_FIX42) {
      reject.setField(SessionRejectReason(err));
    }
  }
  if (msgType != MsgType_Logon && msgType != MsgType_SequenceReset && msgSeqNum == getExpectedTargetNum()) {
    m_state.incrNextTargetMsgSeqNum();
  }

  const char *reason = 0;
  switch (err) {
  case SessionRejectReason_INVALID_TAG_NUMBER:
    reason = SessionRejectReason_INVALID_TAG_NUMBER_TEXT;
    break;
  case SessionRejectReason_REQUIRED_TAG_MISSING:
    reason = SessionRejectReason_REQUIRED_TAG_MISSING_TEXT;
    break;
  case SessionRejectReason_TAG_NOT_DEFINED_FOR_THIS_MESSAGE_TYPE:
    reason = SessionRejectReason_TAG_NOT_DEFINED_FOR_THIS_MESSAGE_TYPE_TEXT;
    break;
  case SessionRejectReason_TAG_SPECIFIED_WITHOUT_A_VALUE:
    reason = SessionRejectReason_TAG_SPECIFIED_WITHOUT_A_VALUE_TEXT;
    break;
  case SessionRejectReason_VALUE_IS_INCORRECT:
    reason = SessionRejectReason_VALUE_IS_INCORRECT_TEXT;
    break;
  case SessionRejectReason_INCORRECT_DATA_FORMAT_FOR_VALUE:
    reason = SessionRejectReason_INCORRECT_DATA_FORMAT_FOR_VALUE_TEXT;
    break;
  case SessionRejectReason_COMPID_PROBLEM:
    reason = SessionRejectReason_COMPID_PROBLEM_TEXT;
    break;
  case SessionRejectReason_SENDINGTIME_ACCURACY_PROBLEM:
    reason = SessionRejectReason_SENDINGTIME_ACCURACY_PROBLEM_TEXT;
    break;
  case SessionRejectReason_INVALID_MSGTYPE:
    reason = SessionRejectReason_INVALID_MSGTYPE_TEXT;
    break;
  case SessionRejectReason_TAG_APPEARS_MORE_THAN_ONCE:
    reason = SessionRejectReason_TAG_APPEARS_MORE_THAN_ONCE_TEXT;
    break;
  case SessionRejectReason_TAG_SPECIFIED_OUT_OF_REQUIRED_ORDER:
    reason = SessionRejectReason_TAG_SPECIFIED_OUT_OF_REQUIRED_ORDER_TEXT;
    break;
  case SessionRejectReason_INCORRECT_NUMINGROUP_COUNT_FOR_REPEATING_GROUP:
    reason = SessionRejectReason_INCORRECT_NUMINGROUP_COUNT_FOR_REPEATING_GROUP_TEXT;
    break;
  };

  if (reason && (field || err == SessionRejectReason_INVALID_TAG_NUMBER)) {
    populateRejectReason(reject, field, reason);
    m_state.onEvent(
        "Message " + msgSeqNum.getString() + " Rejected: " + reason + ":" + SEQNUM_CONVERTOR::convert(field));
  } else if (reason) {
    populateRejectReason(reject, reason);
    m_state.onEvent("Message " + msgSeqNum.getString() + " Rejected: " + reason);
  } else {
    m_state.onEvent("Message " + msgSeqNum.getString() + " Rejected");
  }

  if (!m_state.receivedLogon()) {
    throw std::runtime_error("Tried to send a reject while not logged on");
  }

  sendRaw(reject);
}